

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void get_stripe_boundary_info
               (RestorationTileLimits *limits,int plane_w,int plane_h,int ss_y,int *copy_above,
               int *copy_below)

{
  int iVar1;
  bool bVar2;
  int local_44;
  int last_stripe_in_plane;
  int this_stripe_height;
  int first_stripe_in_plane;
  int runit_offset;
  int full_stripe_height;
  int *copy_below_local;
  int *copy_above_local;
  int ss_y_local;
  int plane_h_local;
  int plane_w_local;
  RestorationTileLimits *limits_local;
  
  *copy_above = 1;
  *copy_below = 1;
  local_44 = 8 >> ((byte)ss_y & 0x1f);
  bVar2 = limits->v_start == 0;
  if (!bVar2) {
    local_44 = 0;
  }
  iVar1 = limits->v_start;
  if (bVar2) {
    *copy_above = 0;
  }
  if (plane_h <= iVar1 + ((0x40 >> ((byte)ss_y & 0x1f)) - local_44)) {
    *copy_below = 0;
  }
  return;
}

Assistant:

static void get_stripe_boundary_info(const RestorationTileLimits *limits,
                                     int plane_w, int plane_h, int ss_y,
                                     int *copy_above, int *copy_below) {
  (void)plane_w;

  *copy_above = 1;
  *copy_below = 1;

  const int full_stripe_height = RESTORATION_PROC_UNIT_SIZE >> ss_y;
  const int runit_offset = RESTORATION_UNIT_OFFSET >> ss_y;

  const int first_stripe_in_plane = (limits->v_start == 0);
  const int this_stripe_height =
      full_stripe_height - (first_stripe_in_plane ? runit_offset : 0);
  const int last_stripe_in_plane =
      (limits->v_start + this_stripe_height >= plane_h);

  if (first_stripe_in_plane) *copy_above = 0;
  if (last_stripe_in_plane) *copy_below = 0;
}